

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchAig.c
# Opt level: O2

Aig_Man_t * Dch_DeriveTotalAig(Vec_Ptr_t *vAigs)

{
  uint __line;
  void *pvVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  char *__assertion;
  int iVar6;
  
  if (vAigs->nSize < 1) {
    __assertion = "Vec_PtrSize(vAigs) > 0";
    __line = 0x46;
  }
  else {
    iVar5 = 0;
    pvVar1 = Vec_PtrEntry(vAigs,0);
    iVar6 = 0;
    while( true ) {
      if (vAigs->nSize <= iVar5) {
        pAVar2 = Aig_ManStart(iVar6);
        for (iVar5 = 0; iVar5 < vAigs->nSize; iVar5 = iVar5 + 1) {
          pvVar3 = Vec_PtrEntry(vAigs,iVar5);
          *(Aig_Obj_t **)(*(long *)((long)pvVar3 + 0x30) + 0x28) = pAVar2->pConst1;
        }
        for (iVar5 = 0; iVar5 < (*(Vec_Ptr_t **)((long)pvVar1 + 0x10))->nSize; iVar5 = iVar5 + 1) {
          Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar1 + 0x10),iVar5);
          pAVar4 = Aig_ObjCreateCi(pAVar2);
          for (iVar6 = 0; iVar6 < vAigs->nSize; iVar6 = iVar6 + 1) {
            pvVar3 = Vec_PtrEntry(vAigs,iVar6);
            pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x10),iVar5);
            *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
          }
        }
        for (iVar5 = 0; iVar5 < (*(Vec_Ptr_t **)((long)pvVar1 + 0x18))->nSize; iVar5 = iVar5 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar1 + 0x18),iVar5);
          for (iVar6 = 0; iVar6 < vAigs->nSize; iVar6 = iVar6 + 1) {
            pvVar3 = Vec_PtrEntry(vAigs,iVar6);
            pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x18),iVar5);
            Dch_DeriveTotalAig_rec
                      (pAVar2,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
          }
          pAVar4 = Aig_ObjChild0Copy(pAVar4);
          Aig_ObjCreateCo(pAVar2,pAVar4);
        }
        return pAVar2;
      }
      pAVar2 = (Aig_Man_t *)Vec_PtrEntry(vAigs,iVar5);
      if (*(int *)((long)pvVar1 + 0x88) != pAVar2->nObjs[2]) break;
      if (*(int *)((long)pvVar1 + 0x8c) != pAVar2->nObjs[3]) {
        __assertion = "Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2)";
        __line = 0x4d;
        goto LAB_005486dc;
      }
      iVar6 = iVar6 + pAVar2->nObjs[5] + pAVar2->nObjs[6];
      Aig_ManCleanData(pAVar2);
      iVar5 = iVar5 + 1;
    }
    __assertion = "Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2)";
    __line = 0x4c;
  }
LAB_005486dc:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchAig.c"
                ,__line,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
}

Assistant:

Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs )
{
    Aig_Man_t * pAig, * pAig2, * pAigTotal;
    Aig_Obj_t * pObj, * pObjPi, * pObjPo;
    int i, k, nNodes;
    assert( Vec_PtrSize(vAigs) > 0 );
    // make sure they have the same number of PIs/POs
    nNodes = 0;
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, i )
    {
        assert( Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2) );
        assert( Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2) );
        nNodes += Aig_ManNodeNum(pAig2);
        Aig_ManCleanData( pAig2 );
    }
    // map constant nodes
    pAigTotal = Aig_ManStart( nNodes );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAigTotal);
    // map primary inputs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pObjPi = Aig_ObjCreateCi( pAigTotal );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
            Aig_ManCi( pAig2, i )->pData = pObjPi;
    }
    // construct the AIG in the order of POs
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        {
            pObjPo = Aig_ManCo( pAig2, i );
            Dch_DeriveTotalAig_rec( pAigTotal, Aig_ObjFanin0(pObjPo) );
        }
        Aig_ObjCreateCo( pAigTotal, Aig_ObjChild0Copy(pObj) );
    }
/*
    // mark the cone of the first AIG
    Aig_ManIncrementTravId( pAigTotal );
    Aig_ManForEachObj( pAig, pObj, i )
        if ( pObj->pData ) 
            Aig_ObjSetTravIdCurrent( pAigTotal, pObj->pData );
*/
    // cleanup should not be done
    return pAigTotal;
}